

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cfd_js_api_json_autogen.h
# Opt level: O0

void __thiscall
cfd::js::api::json::ElementsDecodeRawTransactionTxIn::ElementsDecodeRawTransactionTxIn
          (ElementsDecodeRawTransactionTxIn *this)

{
  allocator local_25 [20];
  allocator local_11;
  ElementsDecodeRawTransactionTxIn *local_10;
  ElementsDecodeRawTransactionTxIn *this_local;
  
  local_10 = this;
  core::JsonClassBase<cfd::js::api::json::ElementsDecodeRawTransactionTxIn>::JsonClassBase
            (&this->super_JsonClassBase<cfd::js::api::json::ElementsDecodeRawTransactionTxIn>);
  (this->super_JsonClassBase<cfd::js::api::json::ElementsDecodeRawTransactionTxIn>).
  _vptr_JsonClassBase = (_func_int **)&PTR__ElementsDecodeRawTransactionTxIn_01b4c468;
  std::
  set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::set(&this->ignore_items);
  std::allocator<char>::allocator();
  std::__cxx11::string::string((string *)&this->coinbase_,"",&local_11);
  std::allocator<char>::~allocator((allocator<char> *)&local_11);
  std::allocator<char>::allocator();
  std::__cxx11::string::string((string *)&this->txid_,"",local_25);
  std::allocator<char>::~allocator((allocator<char> *)local_25);
  this->vout_ = 0;
  DecodeUnlockingScript::DecodeUnlockingScript(&this->script_sig_);
  this->is_pegin_ = false;
  this->sequence_ = 0;
  core::
  JsonValueVector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  ::JsonValueVector(&this->txinwitness_);
  core::
  JsonValueVector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  ::JsonValueVector(&this->pegin_witness_);
  ElementsDecodeIssuance::ElementsDecodeIssuance(&this->issuance_);
  CollectFieldName();
  return;
}

Assistant:

ElementsDecodeRawTransactionTxIn() {
    CollectFieldName();
  }